

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CaliperMetadataDB.cpp
# Opt level: O0

Node * __thiscall
cali::CaliperMetadataDB::CaliperMetadataDBImpl::recursive_merge_node
          (CaliperMetadataDBImpl *this,Node *node,CaliperMetadataAccessInterface *db)

{
  int iVar1;
  cali_attr_type cVar2;
  cali_id_t cVar3;
  reference ppNVar4;
  undefined4 extraout_var;
  Node *pNVar5;
  Node *node_00;
  char *str;
  size_t len;
  cali_id_t attr_id;
  cali_id_t local_90;
  undefined1 local_48 [8];
  Variant v_data;
  Node *parent;
  Node *attr_node;
  CaliperMetadataAccessInterface *db_local;
  Node *node_local;
  CaliperMetadataDBImpl *this_local;
  
  if ((node != (Node *)0x0) && (cVar3 = Node::id(node), cVar3 != 0xffffffffffffffff)) {
    cVar3 = Node::id(node);
    if (cVar3 < 0xc) {
      cVar3 = Node::id(node);
      ppNVar4 = std::vector<cali::Node_*,_std::allocator<cali::Node_*>_>::operator[]
                          (&this->m_nodes,cVar3);
      return *ppNVar4;
    }
    cVar3 = Node::attribute(node);
    iVar1 = (**db->_vptr_CaliperMetadataAccessInterface)(db,cVar3);
    pNVar5 = recursive_merge_node(this,(Node *)CONCAT44(extraout_var,iVar1),db);
    node_00 = util::LockfreeIntrusiveTree<cali::Node>::parent
                        (&node->super_LockfreeIntrusiveTree<cali::Node>);
    v_data.m_v.value.unmanaged_ptr = recursive_merge_node(this,node_00,db);
    _local_48 = (cali_variant_t)Node::data(node);
    cVar2 = Variant::type((Variant *)local_48);
    if (cVar2 == CALI_TYPE_STRING) {
      str = (char *)Variant::data((Variant *)local_48);
      len = Variant::size((Variant *)local_48);
      _local_48 = (cali_variant_t)make_string_variant(this,str,len);
    }
    cVar3 = Node::id(node);
    attr_id = Node::id(pNVar5);
    if (v_data.m_v.value.v_uint == 0) {
      local_90 = 0xffffffffffffffff;
    }
    else {
      local_90 = Node::id((Node *)v_data.m_v.value.unmanaged_ptr);
    }
    pNVar5 = merge_node(this,cVar3,attr_id,local_90,(Variant *)local_48);
    return pNVar5;
  }
  return (Node *)0x0;
}

Assistant:

Node* recursive_merge_node(Node* node, const CaliperMetadataAccessInterface& db)
    {
        if (!node || node->id() == CALI_INV_ID)
            return nullptr;
        if (node->id() < 12)
            return m_nodes[node->id()];

        Node* attr_node = recursive_merge_node(db.node(node->attribute()), db);
        Node* parent    = recursive_merge_node(node->parent(), db);

        Variant v_data = node->data();

        if (v_data.type() == CALI_TYPE_STRING)
            v_data = make_string_variant(static_cast<const char*>(v_data.data()), v_data.size());

        return merge_node(node->id(), attr_node->id(), parent ? parent->id() : CALI_INV_ID, v_data);
    }